

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

const_iterator __thiscall
ghc::filesystem::path::iterator::increment(iterator *this,const_iterator *pos)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  const_iterator cVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  char *pcVar7;
  bool bVar8;
  
  pcVar2 = pos->_M_current;
  if ((this->_first)._M_current == pcVar2) {
    pcVar7 = (this->_last)._M_current;
    if (pcVar7 == pcVar2) {
      return (const_iterator)pcVar2;
    }
    pcVar4 = (this->_prefix)._M_current;
    if (pcVar2 < pcVar4) {
      return (const_iterator)pcVar4;
    }
    bVar8 = true;
    if (*pcVar2 == '/') goto LAB_0011bb1c;
  }
  else {
    pcVar7 = (this->_last)._M_current;
    pcVar4 = (this->_prefix)._M_current;
    bVar8 = pcVar4 == pcVar2;
    if (pcVar7 == pcVar2) {
      return (const_iterator)pcVar2;
    }
    if (*pcVar2 == '/') {
LAB_0011bb1c:
      pcVar4 = pcVar2 + 1;
      cVar5._M_current = pcVar4;
      if ((pcVar4 != pcVar7) && (*pcVar4 == '/')) {
        if ((bVar8) && ((pcVar1 = pcVar2 + 2, pcVar1 == pcVar7 || (*pcVar1 != '/')))) {
          _Var6 = std::
                  __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (pcVar1,pcVar7,&path_helper_base<char>::preferred_separator);
          return (const_iterator)_Var6._M_current;
        }
        lVar3 = 1 - (long)pcVar4;
        for (; (cVar5._M_current = pcVar2 + (long)(pcVar7 + lVar3), pcVar4 != pcVar7 &&
               (cVar5._M_current = pcVar4, *pcVar4 == '/')); pcVar4 = pcVar4 + 1) {
        }
      }
      return (const_iterator)cVar5._M_current;
    }
    if (pcVar4 != pcVar2) goto LAB_0011bb65;
  }
  if ((pcVar2 + 1 != pcVar7) && (pcVar2[1] == ':')) {
    return (const_iterator)(pcVar2 + 2);
  }
LAB_0011bb65:
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (pcVar2 + 1,pcVar7,&path_helper_base<char>::preferred_separator);
  return (const_iterator)_Var6._M_current;
}

Assistant:

GHC_INLINE path::impl_string_type::const_iterator path::iterator::increment(const path::impl_string_type::const_iterator& pos) const
{
    path::impl_string_type::const_iterator i = pos;
    bool fromStart = i == _first || i == _prefix;
    if (i != _last) {
        if (fromStart && i == _first && _prefix > _first) {
            i = _prefix;
        }
        else if (*i++ == preferred_separator) {
            // we can only sit on a slash if it is a network name or a root
            if (i != _last && *i == preferred_separator) {
                if (fromStart && !(i + 1 != _last && *(i + 1) == preferred_separator)) {
                    // leadind double slashes detected, treat this and the
                    // following until a slash as one unit
                    i = std::find(++i, _last, preferred_separator);
                }
                else {
                    // skip redundant slashes
                    while (i != _last && *i == preferred_separator) {
                        ++i;
                    }
                }
            }
        }
        else {
            if (fromStart && i != _last && *i == ':') {
                ++i;
            }
            else {
                i = std::find(i, _last, preferred_separator);
            }
        }
    }
    return i;
}